

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetSOName(string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  ImportInfo *pIVar1;
  long lVar2;
  string *psVar3;
  string name;
  string pdbName;
  string impName;
  string realName;
  
  if (this->Target->IsImportedTarget == true) {
    pIVar1 = GetImportInfo(this,config);
    if (pIVar1 == (ImportInfo *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&name);
    }
    else if (pIVar1->NoSOName == true) {
      cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&pIVar1->Location);
    }
    else {
      psVar3 = &pIVar1->SOName;
      lVar2 = std::__cxx11::string::find((char *)psVar3,0x5760fb);
      if (lVar2 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar3);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
      }
    }
  }
  else {
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    realName._M_dataplus._M_p = (pointer)&realName.field_2;
    realName._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    realName.field_2._M_local_buf[0] = '\0';
    impName._M_dataplus._M_p = (pointer)&impName.field_2;
    impName._M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    impName.field_2._M_local_buf[0] = '\0';
    pdbName._M_dataplus._M_p = (pointer)&pdbName.field_2;
    pdbName._M_string_length = 0;
    pdbName.field_2._M_local_buf[0] = '\0';
    GetLibraryNames(this,&name,__return_storage_ptr__,&realName,&impName,&pdbName,config);
    std::__cxx11::string::~string((string *)&pdbName);
    std::__cxx11::string::~string((string *)&impName);
    std::__cxx11::string::~string((string *)&realName);
    std::__cxx11::string::~string((string *)&name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSOName(const std::string& config) const
{
  if (this->IsImported()) {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (info->NoSOName) {
        // The imported library has no builtin soname so the name
        // searched at runtime will be just the filename.
        return cmSystemTools::GetFilenameName(info->Location);
      }
      // Use the soname given if any.
      if (info->SOName.find("@rpath/") == 0) {
        return info->SOName.substr(6);
      }
      return info->SOName;
    }
    return "";
  }
  // Compute the soname that will be built.
  std::string name;
  std::string soName;
  std::string realName;
  std::string impName;
  std::string pdbName;
  this->GetLibraryNames(name, soName, realName, impName, pdbName, config);
  return soName;
}